

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O3

aspa_status
aspa_array_insert_internal(aspa_array *array,size_t index,aspa_record *record,_Bool copy_providers)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  aspa_status aVar4;
  aspa_record *paVar5;
  uint32_t *__dest;
  long lVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)array->size < array->capacity) {
LAB_00113db8:
    if (record->provider_count == 0) {
      __dest = (uint32_t *)0x0;
    }
    else if (copy_providers) {
      sVar7 = record->provider_count << 2;
      __dest = (uint32_t *)lrtr_malloc(sVar7);
      if (__dest == (uint32_t *)0x0) goto LAB_00113df0;
      memcpy(__dest,record->provider_asns,sVar7);
    }
    else {
      __dest = record->provider_asns;
    }
    lVar6 = array->size - index;
    if (index <= array->size && lVar6 != 0) {
      memmove(array->data + index + 1,array->data + index,lVar6 * 0x18);
    }
    paVar5 = array->data;
    paVar5[index].provider_asns = record->provider_asns;
    uVar2 = *(undefined4 *)&record->field_0x4;
    sVar7 = record->provider_count;
    uVar3 = *(undefined4 *)((long)&record->provider_count + 4);
    paVar5 = paVar5 + index;
    paVar5->customer_asn = record->customer_asn;
    *(undefined4 *)&paVar5->field_0x4 = uVar2;
    *(int *)&paVar5->provider_count = (int)sVar7;
    *(undefined4 *)((long)&paVar5->provider_count + 4) = uVar3;
    array->data[index].provider_asns = __dest;
    array->size = array->size + 1;
    aVar4 = ASPA_SUCCESS;
  }
  else {
    paVar5 = (aspa_record *)lrtr_realloc(array->data,array->capacity * 0x18 + 1000);
    if (paVar5 != (aspa_record *)0x0) {
      array->data = paVar5;
      array->capacity = array->capacity + 1000;
      goto LAB_00113db8;
    }
LAB_00113df0:
    aVar4 = ASPA_ERROR;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar4;
  }
  __stack_chk_fail();
}

Assistant:

static enum aspa_status aspa_array_insert_internal(struct aspa_array *array, size_t index, struct aspa_record *record,
						   bool copy_providers)
{
	// check if this element will fit into the array
	if (array->size >= array->capacity) {
		// increasing the array's size so the new element fits
		if (aspa_array_reallocate(array) != ASPA_SUCCESS)
			return ASPA_ERROR;
	}

	uint32_t *provider_asns = NULL;

	if (record->provider_count > 0) {
		if (copy_providers) {
			size_t provider_size = record->provider_count * sizeof(uint32_t);

			provider_asns = lrtr_malloc(provider_size);
			if (!provider_asns)
				return ASPA_ERROR;

			memcpy(provider_asns, record->provider_asns, provider_size);
		} else {
			provider_asns = record->provider_asns;
		}
	}

	// No need to move if last element
	if (index < array->size) {
		size_t trailing = (array->size - index) * sizeof(struct aspa_record);

		/*               trailing
		 *		     /-------------\
		 * #3 #8 #11 #24 #30 #36 #37
		 * #3 #8 #11  *  #24 #30 #36 #37
		 *            ^   ^
		 *		index   index + 1
		 */
		memmove(&array->data[index + 1], &array->data[index], trailing);
	}

	// append the record at the end
	array->data[index] = *record;
	array->data[index].provider_asns = provider_asns;
	array->size += 1;

	return ASPA_SUCCESS;
}